

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.c
# Opt level: O0

UInt32 Hc3Zip_MatchFinder_GetMatches(CMatchFinder *p,UInt32 *distances)

{
  uint lenLimit_00;
  UInt32 curMatch_00;
  undefined1 *puVar1;
  uint uVar2;
  int iVar3;
  UInt32 *pUVar4;
  UInt32 *in_RSI;
  long *in_RDI;
  UInt32 curMatch;
  Byte *cur;
  UInt32 hv;
  UInt32 lenLimit;
  UInt32 offset;
  UInt32 local_4;
  
  lenLimit_00 = *(uint *)((long)in_RDI + 0x14);
  if (lenLimit_00 < 3) {
    MatchFinder_MovePos((CMatchFinder *)0x11fdbb);
    local_4 = 0;
  }
  else {
    puVar1 = (undefined1 *)*in_RDI;
    uVar2 = ((uint)CONCAT11(*puVar1,puVar1[2]) ^
            *(uint *)((long)in_RDI + (ulong)(byte)puVar1[1] * 4 + 0x78)) & 0xffff;
    curMatch_00 = *(UInt32 *)(in_RDI[5] + (ulong)uVar2 * 4);
    *(int *)(in_RDI[5] + (ulong)uVar2 * 4) = (int)in_RDI[1];
    pUVar4 = Hc_GetMatchesSpec(lenLimit_00,curMatch_00,*(UInt32 *)(in_RDI + 1),(Byte *)*in_RDI,
                               (CLzRef *)in_RDI[6],*(UInt32 *)(in_RDI + 3),
                               *(UInt32 *)((long)in_RDI + 0x1c),*(UInt32 *)((long)in_RDI + 0x3c),
                               in_RSI,2);
    local_4 = (UInt32)((long)pUVar4 - (long)in_RSI >> 2);
    *(int *)(in_RDI + 3) = (int)in_RDI[3] + 1;
    *in_RDI = *in_RDI + 1;
    iVar3 = (int)in_RDI[1] + 1;
    *(int *)(in_RDI + 1) = iVar3;
    if (iVar3 == *(int *)((long)in_RDI + 0xc)) {
      MatchFinder_CheckLimits((CMatchFinder *)0x11fedd);
    }
  }
  return local_4;
}

Assistant:

UInt32 Hc3Zip_MatchFinder_GetMatches(CMatchFinder *p, UInt32 *distances)
{
  UInt32 offset;
  GET_MATCHES_HEADER(3)
  HASH_ZIP_CALC;
  curMatch = p->hash[hv];
  p->hash[hv] = p->pos;
  offset = (UInt32)(Hc_GetMatchesSpec(lenLimit, curMatch, MF_PARAMS(p),
      distances, 2) - (distances));
  MOVE_POS_RET
}